

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * multadd(Bigint *b,int m,int a)

{
  int iVar1;
  Bigint *pBVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = b->wds;
  uVar6 = (ulong)a;
  iVar3 = 1;
  if (1 < iVar1) {
    iVar3 = iVar1;
  }
  lVar4 = 0;
  do {
    uVar5 = (ulong)b->x[lVar4] * (long)m + uVar6;
    uVar6 = uVar5 >> 0x20;
    b->x[lVar4] = (uint32)uVar5;
    lVar4 = lVar4 + 1;
  } while (iVar3 != (int)lVar4);
  pBVar2 = b;
  if (uVar5 >> 0x20 != 0) {
    if (b->maxwds <= iVar1) {
      pBVar2 = Balloc(b->k + 1);
      if (pBVar2 == (Bigint *)0x0) {
        ckd_free(b);
        return (Bigint *)0x0;
      }
      memcpy(&pBVar2->sign,&b->sign,(long)b->wds * 4 + 8);
      ckd_free(b);
    }
    pBVar2->x[iVar1] = (uint32)(uVar5 >> 0x20);
    pBVar2->wds = iVar1 + 1;
  }
  return pBVar2;
}

Assistant:

static Bigint *
multadd(Bigint *b, int m, int a)       /* multiply by m and add a */
{
    int i, wds;
#ifdef ULLong
    ULong *x;
    ULLong carry, y;
#else
    ULong carry, *x, y;
    ULong xi, z;
#endif
    Bigint *b1;

    wds = b->wds;
    x = b->x;
    i = 0;
    carry = a;
    do {
#ifdef ULLong
        y = *x * (ULLong)m + carry;
        carry = y >> 32;
        *x++ = (ULong)(y & FFFFFFFF);
#else
        xi = *x;
        y = (xi & 0xffff) * m + carry;
        z = (xi >> 16) * m + (y >> 16);
        carry = z >> 16;
        *x++ = (z << 16) + (y & 0xffff);
#endif
    }
    while(++i < wds);
    if (carry) {
        if (wds >= b->maxwds) {
            b1 = Balloc(b->k+1);
            if (b1 == NULL){
                Bfree(b);
                return NULL;
            }
            Bcopy(b1, b);
            Bfree(b);
            b = b1;
        }
        b->x[wds++] = (ULong)carry;
        b->wds = wds;
    }
    return b;
}